

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cpu_mips_store_status_mips(CPUMIPSState *env,target_ulong_conflict val)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = env->CP0_Status_rw_bitmask;
  if ((env->insn_flags & 0x2000) != 0) {
    uVar1 = uVar3 & 0xffffffe7;
    if ((~(uVar3 & val) & 0x18) != 0) {
      uVar1 = uVar3;
    }
    uVar3 = (~val | 0xffe7ffff) & uVar1;
  }
  env->CP0_Status = (val ^ env->CP0_Status) & uVar3 ^ env->CP0_Status;
  if ((env->CP0_Config3 & 4) != 0) {
    sync_c0_status_mips(env,env,env->current_tc);
    return;
  }
  uVar3 = env->hflags;
  uVar4 = uVar3 & 0xc8a7fd04;
  env->hflags = uVar4;
  uVar1 = env->CP0_Status;
  uVar5 = 0x10000000;
  if ((uVar1 & 4) == 0) {
    if ((uVar3 & 4) == 0 && (uVar1 & 2) == 0) {
      uVar5 = uVar1 >> 3 & 3;
      goto LAB_00755328;
    }
  }
  else {
LAB_00755328:
    uVar4 = uVar4 | uVar5;
    env->hflags = uVar4;
  }
  if ((((uVar1 >> 0x1c & 1) != 0) && ((env->insn_flags & 0x2000) == 0)) || ((uVar4 & 3) == 0)) {
    uVar4 = uVar4 | 0x10;
    env->hflags = uVar4;
  }
  uVar3 = uVar1 >> 0x14 & 0x40 | uVar1 >> 0x18 & 0x20 | uVar4;
  if ((uVar1 & 0x24000000) != 0) {
    env->hflags = uVar3;
  }
  if (((uVar4 & 3) != 0) && ((env->CP0_Config5 & 0x40) != 0)) {
    uVar3 = uVar3 | 0x400000;
    env->hflags = uVar3;
  }
  uVar2 = env->insn_flags;
  if ((uVar2 >> 0x25 & 1) == 0) {
    if ((uVar2 >> 0x24 & 1) != 0) {
      uVar4 = 0x180000;
      goto LAB_007553cf;
    }
    uVar4 = 0x80000;
    if ((uVar1 >> 0x18 & 1) != 0 && (uVar2 >> 0x23 & 1) != 0) goto LAB_007553d5;
  }
  else {
    uVar4 = 0x20180000;
LAB_007553cf:
    if ((uVar1 >> 0x18 & 1) != 0) {
LAB_007553d5:
      uVar3 = uVar3 | uVar4;
      env->hflags = uVar3;
    }
  }
  if ((uVar2 & 0x40) == 0) {
    if (((uVar2 & 0x20) != 0) || (-1 < (int)uVar1 || (uVar2 & 8) == 0)) goto LAB_0075540e;
  }
  else if (((env->active_fpu).fcr0 & 0x400000) == 0) goto LAB_0075540e;
  uVar3 = uVar3 | 0x80;
  env->hflags = uVar3;
LAB_0075540e:
  if (((uVar2 >> 0x29 & 1) != 0) && ((env->CP0_Config5 & 0x8000000) != 0)) {
    uVar3 = uVar3 | 0x1000000;
    env->hflags = uVar3;
  }
  if ((((env->active_fpu).fcr0 & 0x20000000) != 0) && ((env->CP0_Config5 & 0x100) != 0)) {
    uVar3 = uVar3 | 0x2000000;
    env->hflags = uVar3;
  }
  if (((env->CP0_Config3 & 0x80) != 0) && ((env->CP0_PageGrain & 0x20000000) != 0)) {
    env->hflags = uVar3 | 0x4000000;
  }
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}